

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

int phosg::rename(char *__old,char *__new)

{
  int iVar1;
  runtime_error *this;
  uint *puVar2;
  int error;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = ::rename(*(char **)__old,*(char **)__new);
  if (iVar1 == 0) {
    return 0;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_c0,"can\'t rename file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__old);
  ::std::operator+(&local_a0,&local_c0," to ");
  ::std::operator+(&local_80,&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__new);
  ::std::operator+(&local_60,&local_80,": ");
  puVar2 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&local_e0,(phosg *)(ulong)*puVar2,error);
  ::std::operator+(&local_40,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  ::std::runtime_error::runtime_error(this,(string *)&local_40);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void rename(const std::string& old_filename, const std::string& new_filename) {
  if (::rename(old_filename.c_str(), new_filename.c_str()) != 0) {
    throw runtime_error("can\'t rename file " + old_filename + " to " + new_filename + ": " + string_for_error(errno));
  }
}